

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O0

void help(void)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>
  *this;
  ulong uVar2;
  size_type sVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>
  *cmd;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>_>
  *__range1;
  int count;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>_>
  *in_stack_ffffffffffffffb8;
  FILE *__stream;
  char local_29;
  _Self local_20;
  _Self local_18;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>_>
  *local_10;
  int local_4;
  
  fprintf(_stderr,"usage: imgtool <command> [options]\n\n");
  fprintf(_stderr,"where <command> is:");
  local_4 = 0;
  local_10 = &commandUsage_abi_cxx11_;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>_>
       ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>
                 *)0x3d0fac);
    __stream = _stderr;
    this = (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>
            *)std::__cxx11::string::c_str();
    local_4 = local_4 + 1;
    uVar2 = (ulong)local_4;
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>_>
            ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>_>
                    *)0x3d0fec);
    local_29 = ',';
    if (sVar3 <= uVar2) {
      local_29 = ' ';
    }
    fprintf(__stream," %s%c",this,(ulong)(uint)(int)local_29);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>
    ::operator++(this);
  }
  fprintf(_stderr,"\n\n");
  fprintf(_stderr,"\"imgtool help <command>\" provides detailed information about <command>.\n");
  return;
}

Assistant:

void help() {
    fprintf(stderr, "usage: imgtool <command> [options]\n\n");
    fprintf(stderr, "where <command> is:");
    int count = 0;
    for (const auto &cmd : commandUsage)
        fprintf(stderr, " %s%c", cmd.first.c_str(),
                ++count < commandUsage.size() ? ',' : ' ');
    fprintf(stderr, "\n\n");
    fprintf(stderr, "\"imgtool help <command>\" provides detailed information "
                    "about <command>.\n");
}